

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O3

int skip_sep(LexState *ls)

{
  MSize *pMVar1;
  MSize MVar2;
  uint c;
  byte *pbVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  c = ls->current;
  uVar4 = (ls->sb).n;
  uVar5 = uVar4 + 1;
  if ((ls->sb).sz < uVar5) {
    save_grow(ls,c);
  }
  else {
    (ls->sb).n = uVar5;
    (ls->sb).buf[uVar4] = (char)c;
  }
  pMVar1 = &ls->n;
  MVar2 = *pMVar1;
  *pMVar1 = *pMVar1 - 1;
  if (MVar2 == 0) {
    uVar4 = fillbuf(ls);
  }
  else {
    pbVar3 = (byte *)ls->p;
    ls->p = (char *)(pbVar3 + 1);
    uVar4 = (uint)*pbVar3;
  }
  ls->current = uVar4;
  uVar5 = 0;
  if (uVar4 == 0x3d) {
    uVar5 = 0;
    do {
      uVar4 = (ls->sb).n;
      uVar6 = uVar4 + 1;
      if ((ls->sb).sz < uVar6) {
        save_grow(ls,0x3d);
      }
      else {
        (ls->sb).n = uVar6;
        (ls->sb).buf[uVar4] = '=';
      }
      pMVar1 = &ls->n;
      MVar2 = *pMVar1;
      *pMVar1 = *pMVar1 - 1;
      if (MVar2 == 0) {
        uVar4 = fillbuf(ls);
      }
      else {
        pbVar3 = (byte *)ls->p;
        ls->p = (char *)(pbVar3 + 1);
        uVar4 = (uint)*pbVar3;
      }
      ls->current = uVar4;
      uVar5 = uVar5 + 1;
    } while (uVar4 == 0x3d);
  }
  return -(uint)(uVar4 != c) ^ uVar5;
}

Assistant:

static int skip_sep(LexState *ls)
{
  int count = 0;
  int s = ls->current;
  lua_assert(s == '[' || s == ']');
  save_and_next(ls);
  while (ls->current == '=') {
    save_and_next(ls);
    count++;
  }
  return (ls->current == s) ? count : (-count) - 1;
}